

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::vector<double,std::allocator<double>>>::
internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,
          vector<double,_std::allocator<double>_> *data)

{
  byte bVar1;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  bool result;
  vector<double,_std::allocator<double>_> tmp;
  RepType *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this_00;
  
  __x = (vector<double,_std::allocator<double>_> *)0x0;
  this_00 = (vector<double,_std::allocator<double>_> *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2abf68);
  std::vector<double,_std::allocator<double>_>::vector(this_00,__x);
  bVar1 = ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert
                    ((RepType *)
                     CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                     in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::~vector(in_RSI);
  bVar1 = bVar1 & 1;
  if (bVar1 != 0) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000030,in_stack_00000028);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_RSI);
  return (bool)(bVar1 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }